

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O2

void __thiscall
BasicTestingSetup::BasicTestingSetup(BasicTestingSetup *this,ChainType chainType,TestOpts opts)

{
  NodeContext *this_00;
  path *this_01;
  path *this_02;
  ArgsManager *pAVar1;
  Chain *pCVar2;
  vector<const_char_*,_std::allocator<const_char_*>_> v1;
  vector<const_char_*,_std::allocator<const_char_*>_> v1_00;
  string arg;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  _Alloc_hider _Var3;
  bool bVar4;
  LockResult LVar5;
  ostream *poVar6;
  Logger *pLVar7;
  runtime_error *this_03;
  undefined8 extraout_RAX;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  undefined8 *puVar9;
  string *psVar10;
  long in_FS_OFFSET;
  byte bVar11;
  initializer_list<const_char_*> __l;
  string_view str_err;
  string_view str_err_00;
  string_view str_err_01;
  undefined4 in_stack_fffffffffffffd18;
  ArgsManager *this_04;
  undefined8 in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_2b8;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_2a0;
  vector<const_char_*,_std::allocator<const_char_*>_> arguments;
  OptionsCategory local_270;
  allocator<char> local_269;
  path local_268;
  path local_240;
  path local_218;
  undefined1 local_1f0 [72];
  string error;
  path local_160;
  string test_path;
  path local_110;
  path local_e8;
  path root_dir;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  bVar11 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  util::SignalInterrupt::SignalInterrupt(&this->m_interrupt);
  this_00 = &this->m_node;
  ::node::NodeContext::NodeContext(this_00);
  FastRandomContext::FastRandomContext(&this->m_rng,false);
  this_01 = &this->m_path_root;
  std::filesystem::__cxx11::path::path(&this_01->super_path);
  this_02 = &this->m_path_lock;
  std::filesystem::__cxx11::path::path(&this_02->super_path);
  this->m_has_custom_datadir = false;
  this_04 = &this->m_args;
  ArgsManager::ArgsManager(this_04);
  (this->m_node).shutdown = &this->m_interrupt;
  (this->m_node).args = &gArgs;
  puVar9 = &DAT_0114f678;
  psVar10 = &error;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    (psVar10->_M_dataplus)._M_p = (pointer)*puVar9;
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
    psVar10 = (string *)((long)psVar10 + (ulong)bVar11 * -0x10 + 8);
  }
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&root_dir;
  __l._M_len = 9;
  __l._M_array = (iterator)&error;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_2a0,__l,
             (allocator_type *)args);
  v1.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data
  ._M_start._4_4_ = chainType;
  v1.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data
  ._M_start._0_4_ = in_stack_fffffffffffffd18;
  v1.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)this_04;
  v1.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffffd28;
  Cat<std::vector<char_const*,std::allocator<char_const*>>>
            (&arguments,v1,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_2a0);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_2a0);
  if (G_TEST_COMMAND_LINE_ARGUMENTS.super__Function_base._M_manager != (_Manager_type)0x0) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_2b8,&arguments);
    std::function<std::vector<const_char_*,_std::allocator<const_char_*>_>_()>::operator()
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&root_dir,
               &G_TEST_COMMAND_LINE_ARGUMENTS);
    v1_00.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = chainType;
    v1_00.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffffd18;
    v1_00.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)this_04;
    v1_00.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd28;
    Cat<std::vector<char_const*,std::allocator<char_const*>>>
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&error,v1_00,
               (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_2b8);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::_M_move_assign(&arguments,&error);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&error);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&root_dir);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_2b8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"test",(allocator<char> *)&root_dir);
  util::ThreadRename(&error);
  std::__cxx11::string::~string((string *)&error);
  ArgsManager::ClearPathCache(&gArgs);
  SetupServerArgs((this->m_node).args);
  pAVar1 = (this->m_node).args;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"-testdatadir",&local_269);
  std::filesystem::temp_directory_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)&test_path,&TEST_DIR_PATH_ELEMENT,auto_format);
  std::filesystem::__cxx11::operator/(&local_e8,&local_110,(path *)&test_path);
  std::filesystem::__cxx11::path::path<char[1],std::filesystem::__cxx11::path>
            (&local_160,(char (*) [1])0xc7f1cc,auto_format);
  std::filesystem::__cxx11::operator/(&root_dir.super_path,&local_e8,&local_160);
  std::filesystem::__cxx11::path::path((path *)&error,&root_dir.super_path);
  std::filesystem::__cxx11::path::string(&local_98,(path *)&error);
  tinyformat::format<std::__cxx11::string>
            (&local_78,(tinyformat *)"Custom data directory (default: %s<random_string>)",
             (char *)&local_98,args);
  local_270 = DEBUG_TEST;
  ArgsManager::AddArg(pAVar1,&local_58,&local_78,1,&local_270);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::filesystem::__cxx11::path::~path((path *)&error);
  std::filesystem::__cxx11::path::~path(&root_dir.super_path);
  std::filesystem::__cxx11::path::~path(&local_160);
  std::filesystem::__cxx11::path::~path(&local_e8);
  std::filesystem::__cxx11::path::~path((path *)&test_path);
  std::filesystem::__cxx11::path::~path(&local_110);
  std::__cxx11::string::~string((string *)&local_58);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_allocated_capacity = error.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar4 = ArgsManager::ParseParameters
                    ((this->m_node).args,
                     (int)((ulong)((long)arguments.
                                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)arguments.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3),
                     arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,&error);
  if (!bVar4) {
    ArgsManager::ClearArgs((this->m_node).args);
    this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_03,(string *)&error);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00693b1b;
  }
  std::__cxx11::string::~string((string *)&error);
  SeedRandomForTest(this,FIXED_SEED);
  pAVar1 = (this->m_node).args;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"-testdatadir",(allocator<char> *)&root_dir);
  bVar4 = ArgsManager::IsArgSet(pAVar1,&error);
  std::__cxx11::string::~string((string *)&error);
  if (!bVar4) {
    RandomMixin<FastRandomContext>::rand256
              ((uint256 *)&error,&g_rng_temp_path.super_RandomMixin<FastRandomContext>);
    base_blob<256u>::ToString_abi_cxx11_(&test_path,(base_blob<256u> *)&error);
    std::filesystem::temp_directory_path_abi_cxx11_();
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_e8,&TEST_DIR_PATH_ELEMENT,auto_format);
    std::filesystem::__cxx11::operator/((path *)&error,&root_dir.super_path,&local_e8);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_110,&test_path,auto_format);
    std::filesystem::__cxx11::operator/((path *)(local_1f0 + 0x20),(path *)&error,&local_110);
    std::filesystem::__cxx11::path::operator=(&this_01->super_path,(path *)(local_1f0 + 0x20));
    std::filesystem::__cxx11::path::~path((path *)(local_1f0 + 0x20));
    std::filesystem::__cxx11::path::~path(&local_110);
    std::filesystem::__cxx11::path::~path((path *)&error);
    std::filesystem::__cxx11::path::~path(&local_e8);
    std::filesystem::__cxx11::path::~path(&root_dir.super_path);
    TryCreateDirectories(this_01);
    std::__cxx11::string::~string((string *)&test_path);
LAB_00693392:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error,"-datadir",(allocator<char> *)&local_e8);
    std::filesystem::__cxx11::path::string((string *)&root_dir,&this_01->super_path);
    ArgsManager::ForceSetArg(this_04,&error,(string *)&root_dir);
    std::__cxx11::string::~string((string *)&root_dir);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error,"-datadir",(allocator<char> *)&local_e8);
    std::filesystem::__cxx11::path::string((string *)&root_dir,&this_01->super_path);
    ArgsManager::ForceSetArg(&gArgs,&error,(string *)&root_dir);
    std::__cxx11::string::~string((string *)&root_dir);
    std::__cxx11::string::~string((string *)&error);
    SelectParams(chainType);
    if (G_TEST_LOG_FUN_abi_cxx11_.super__Function_base._M_manager != (_Manager_type)0x0) {
      pLVar7 = LogInstance();
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&stack0xfffffffffffffd28,&G_TEST_LOG_FUN_abi_cxx11_);
      fun.super__Function_base._M_functor._4_4_ = chainType;
      fun.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffd18;
      fun.super__Function_base._M_functor._8_8_ = this_04;
      fun.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffd28;
      fun._M_invoker = (_Invoker_type)in_stack_fffffffffffffd30;
      BCLog::Logger::PushBackCallback(pLVar7,fun);
      std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffd28);
    }
    InitLogging((this->m_node).args);
    AppInitParameterInteraction((this->m_node).args);
    pLVar7 = LogInstance();
    BCLog::Logger::StartLogging(pLVar7);
    std::make_unique<node::Warnings>();
    _Var3 = error._M_dataplus;
    error._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>::reset
              ((__uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_> *)
               &(this->m_node).warnings,(pointer)_Var3._M_p);
    std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::~unique_ptr
              ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)&error);
    std::make_unique<kernel::Context>();
    _Var3 = error._M_dataplus;
    error._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>::reset
              ((__uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_> *)this_00,
               (pointer)_Var3._M_p);
    std::unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_>::~unique_ptr
              ((unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> *)&error);
    std::make_unique<ECC_Context>();
    _Var3 = error._M_dataplus;
    error._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>::reset
              ((__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> *)
               &(this->m_node).ecc_context,(pointer)_Var3._M_p);
    std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::~unique_ptr
              ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)&error);
    SetupEnvironment();
    interfaces::MakeChain((interfaces *)&error,this_00);
    _Var3 = error._M_dataplus;
    error._M_dataplus._M_p = (pointer)0x0;
    pCVar2 = (this->m_node).chain._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
    (this->m_node).chain._M_t.
    super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
    super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
    super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl = (Chain *)_Var3._M_p;
    if (pCVar2 != (Chain *)0x0) {
      (*pCVar2->_vptr_Chain[1])();
      if (error._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)error._M_dataplus._M_p + 8))();
      }
    }
    if (BasicTestingSetup(ChainType,TestOpts)::noui_connected == '\0') {
      noui_connect();
      BasicTestingSetup(ChainType,TestOpts)::noui_connected = '\x01';
    }
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    goto LAB_00693b1b;
  }
  this->m_has_custom_datadir = true;
  pAVar1 = (this->m_node).args;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f0,"-testdatadir",(allocator<char> *)&local_e8);
  error.field_2._M_allocated_capacity = 0;
  error.field_2._8_8_ = 0;
  error._M_dataplus._M_p = (pointer)0x0;
  error._M_string_length = 0;
  std::filesystem::__cxx11::path::path((path *)&error);
  arg._M_dataplus._M_p._4_4_ = chainType;
  arg._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffd18;
  arg._M_string_length = (size_type)this_04;
  arg.field_2._M_allocated_capacity = in_stack_fffffffffffffd28;
  arg.field_2._8_8_ = in_stack_fffffffffffffd30;
  ArgsManager::GetPathArg(&root_dir,pAVar1,arg,(path *)local_1f0);
  std::filesystem::__cxx11::path::~path((path *)&error);
  std::__cxx11::string::~string((string *)local_1f0);
  if (root_dir.super_path._M_pathname._M_string_length == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00693b1b;
    str_err._M_str = "-testdatadir argument is empty, please specify a path";
    str_err._M_len = 0x35;
    ExitFailure(str_err);
LAB_0069365a:
    std::filesystem::__cxx11::path::string(&local_160._M_pathname,&this_02->super_path);
    std::operator+(&local_110._M_pathname,"Cannot obtain a lock on test data lock directory ",
                   &local_160._M_pathname);
    std::operator+(&local_e8._M_pathname,&local_110._M_pathname,'\n');
    std::operator+(&error,&local_e8._M_pathname,"The test executable is probably already running.");
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00693b1b;
    str_err_00._M_str = error._M_dataplus._M_p;
    str_err_00._M_len = error._M_string_length;
    ExitFailure(str_err_00);
  }
  else {
    std::filesystem::absolute((path *)&error);
    std::filesystem::__cxx11::path::path(&local_e8,(path *)&error);
    std::filesystem::__cxx11::path::~path((path *)&error);
    std::filesystem::__cxx11::path::operator=(&root_dir.super_path,&local_e8);
    std::filesystem::__cxx11::path::~path(&local_e8);
    if (G_TEST_GET_FULL_NAME_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&test_path,"",(allocator<char> *)&error);
    }
    else {
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
      operator()(&test_path,&G_TEST_GET_FULL_NAME_abi_cxx11_);
    }
    std::filesystem::__cxx11::path::path(&local_240,&root_dir.super_path);
    fs::operator/((path *)&local_218,(path *)&local_240,"test_common bitcoin");
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&error,&test_path,auto_format);
    std::filesystem::__cxx11::path::path(&local_110,(path *)&error);
    std::filesystem::__cxx11::path::~path((path *)&error);
    std::filesystem::__cxx11::path::operator/=(&local_218,(path *)&local_110);
    std::filesystem::__cxx11::path::path(&local_e8,&local_218);
    std::filesystem::__cxx11::path::operator=(&this_02->super_path,&local_e8);
    std::filesystem::__cxx11::path::~path(&local_e8);
    std::filesystem::__cxx11::path::~path(&local_110);
    std::filesystem::__cxx11::path::~path(&local_218);
    std::filesystem::__cxx11::path::~path(&local_240);
    std::filesystem::__cxx11::path::path(&local_268,&this_02->super_path);
    fs::operator/((path *)&error,(path *)&local_268,"datadir");
    std::filesystem::__cxx11::path::operator=(&this_01->super_path,(path *)&error);
    std::filesystem::__cxx11::path::~path((path *)&error);
    std::filesystem::__cxx11::path::~path(&local_268);
    TryCreateDirectories(this_02);
    fs::path::path((path *)&error,".lock");
    LVar5 = util::LockDirectory(this_02,(path *)&error,false);
    std::filesystem::__cxx11::path::~path((path *)&error);
    if (LVar5 != Success) goto LAB_0069365a;
    std::filesystem::remove_all((path *)this_01);
    bVar4 = TryCreateDirectories(this_01);
    if (bVar4) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Test directory (will not be deleted): ");
      poVar6 = (ostream *)
               std::filesystem::__cxx11::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,
                          &this_01->super_path);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&test_path);
      std::filesystem::__cxx11::path::~path(&root_dir.super_path);
      goto LAB_00693392;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    str_err_01._M_str = "Cannot create test data directory";
    str_err_01._M_len = 0x21;
    ExitFailure(str_err_01);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&test_path);
    std::filesystem::__cxx11::path::~path(&root_dir.super_path);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    ArgsManager::~ArgsManager(this_04);
    std::filesystem::__cxx11::path::~path(&this_02->super_path);
    std::filesystem::__cxx11::path::~path(&this_01->super_path);
    ChaCha20::~ChaCha20(&(this->m_rng).rng);
    ::node::NodeContext::~NodeContext(this_00);
    util::SignalInterrupt::~SignalInterrupt(&this->m_interrupt);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(extraout_RAX);
    }
  }
LAB_00693b1b:
  __stack_chk_fail();
}

Assistant:

BasicTestingSetup::BasicTestingSetup(const ChainType chainType, TestOpts opts)
    : m_args{}
{
    m_node.shutdown = &m_interrupt;
    m_node.args = &gArgs;
    std::vector<const char*> arguments = Cat(
        {
            "dummy",
            "-printtoconsole=0",
            "-logsourcelocations",
            "-logtimemicros",
            "-logthreadnames",
            "-loglevel=trace",
            "-debug",
            "-debugexclude=libevent",
            "-debugexclude=leveldb",
        },
        opts.extra_args);
    if (G_TEST_COMMAND_LINE_ARGUMENTS) {
        arguments = Cat(arguments, G_TEST_COMMAND_LINE_ARGUMENTS());
    }
    util::ThreadRename("test");
    gArgs.ClearPathCache();
    {
        SetupServerArgs(*m_node.args);
        SetupUnitTestArgs(*m_node.args);
        std::string error;
        if (!m_node.args->ParseParameters(arguments.size(), arguments.data(), error)) {
            m_node.args->ClearArgs();
            throw std::runtime_error{error};
        }
    }

    // Use randomly chosen seed for deterministic PRNG, so that (by default) test
    // data directories use a random name that doesn't overlap with other tests.
    SeedRandomForTest(SeedRand::FIXED_SEED);

    if (!m_node.args->IsArgSet("-testdatadir")) {
        // By default, the data directory has a random name
        const auto rand_str{g_rng_temp_path.rand256().ToString()};
        m_path_root = fs::temp_directory_path() / TEST_DIR_PATH_ELEMENT / rand_str;
        TryCreateDirectories(m_path_root);
    } else {
        // Custom data directory
        m_has_custom_datadir = true;
        fs::path root_dir{m_node.args->GetPathArg("-testdatadir")};
        if (root_dir.empty()) ExitFailure("-testdatadir argument is empty, please specify a path");

        root_dir = fs::absolute(root_dir);
        const std::string test_path{G_TEST_GET_FULL_NAME ? G_TEST_GET_FULL_NAME() : ""};
        m_path_lock = root_dir / TEST_DIR_PATH_ELEMENT / fs::PathFromString(test_path);
        m_path_root = m_path_lock / "datadir";

        // Try to obtain the lock; if unsuccessful don't disturb the existing test.
        TryCreateDirectories(m_path_lock);
        if (util::LockDirectory(m_path_lock, ".lock", /*probe_only=*/false) != util::LockResult::Success) {
            ExitFailure("Cannot obtain a lock on test data lock directory " + fs::PathToString(m_path_lock) + '\n' + "The test executable is probably already running.");
        }

        // Always start with a fresh data directory; this doesn't delete the .lock file located one level above.
        fs::remove_all(m_path_root);
        if (!TryCreateDirectories(m_path_root)) ExitFailure("Cannot create test data directory");

        // Print the test directory name if custom.
        std::cout << "Test directory (will not be deleted): " << m_path_root << std::endl;
    }
    m_args.ForceSetArg("-datadir", fs::PathToString(m_path_root));
    gArgs.ForceSetArg("-datadir", fs::PathToString(m_path_root));

    SelectParams(chainType);
    if (G_TEST_LOG_FUN) LogInstance().PushBackCallback(G_TEST_LOG_FUN);
    InitLogging(*m_node.args);
    AppInitParameterInteraction(*m_node.args);
    LogInstance().StartLogging();
    m_node.warnings = std::make_unique<node::Warnings>();
    m_node.kernel = std::make_unique<kernel::Context>();
    m_node.ecc_context = std::make_unique<ECC_Context>();
    SetupEnvironment();

    m_node.chain = interfaces::MakeChain(m_node);
    static bool noui_connected = false;
    if (!noui_connected) {
        noui_connect();
        noui_connected = true;
    }
}